

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

int __thiscall SHA256::init(SHA256 *this,EVP_PKEY_CTX *ctx)

{
  SHA256 *this_local;
  
  this->m_h[0] = 0x6a09e667;
  this->m_h[1] = 0xbb67ae85;
  this->m_h[2] = 0x3c6ef372;
  this->m_h[3] = 0xa54ff53a;
  this->m_h[4] = 0x510e527f;
  this->m_h[5] = 0x9b05688c;
  this->m_h[6] = 0x1f83d9ab;
  this->m_h[7] = 0x5be0cd19;
  this->m_len = 0;
  this->m_tot_len = 0;
  return (int)this;
}

Assistant:

void SHA256::init()
{
    m_h[0] = 0x6a09e667;
    m_h[1] = 0xbb67ae85;
    m_h[2] = 0x3c6ef372;
    m_h[3] = 0xa54ff53a;
    m_h[4] = 0x510e527f;
    m_h[5] = 0x9b05688c;
    m_h[6] = 0x1f83d9ab;
    m_h[7] = 0x5be0cd19;
    m_len = 0;
    m_tot_len = 0;
}